

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChromaticities.cpp
# Opt level: O2

M44f * Imf_3_2::RGBtoXYZ(M44f *__return_storage_ptr__,Chromaticities *chroma,float Y)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined4 in_EAX;
  uint uVar3;
  invalid_argument *this;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  fVar6 = (chroma->white).x;
  fVar17 = (chroma->white).y;
  auVar15._0_4_ = fVar6 * Y;
  if (ABS(fVar17) <= 1.0) {
    if (ABS(fVar17) * 3.4028235e+38 <= ABS(auVar15._0_4_)) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Bad chromaticities: white.y cannot be zero");
      goto LAB_00159614;
    }
  }
  auVar15._4_4_ = ((1.0 - fVar6) - fVar17) * Y;
  auVar15._8_8_ = 0;
  auVar1._4_4_ = fVar17;
  auVar1._0_4_ = fVar17;
  auVar1._8_4_ = fVar17;
  auVar1._12_4_ = fVar17;
  auVar15 = divps(auVar15,auVar1);
  fVar8 = (chroma->blue).x;
  fVar9 = (chroma->blue).y;
  fVar12 = (chroma->red).x;
  fVar13 = (chroma->red).y;
  fVar10 = (chroma->green).x;
  fVar11 = (chroma->green).y;
  fVar14 = auVar15._0_4_;
  fVar17 = auVar15._4_4_ + fVar14;
  fVar19 = (fVar9 + -1.0) * Y + fVar9 * fVar17;
  fVar16 = fVar10 * (fVar13 - fVar9) + (fVar9 - fVar11) * fVar12 + fVar8 * (fVar11 - fVar13);
  fVar6 = Y * (fVar13 + -1.0) + fVar17 * fVar13;
  fVar7 = Y * (fVar11 + -1.0) + fVar17 * fVar11;
  fVar18 = -fVar8 * fVar6 + fVar14 * (fVar13 - fVar9) + fVar19 * fVar12;
  fVar17 = fVar8 * fVar7 + fVar14 * (fVar9 - fVar11) + fVar19 * -fVar10;
  fVar6 = ((fVar11 - fVar13) * fVar14 - fVar7 * fVar12) + fVar10 * fVar6;
  if (ABS(fVar16) < 1.0) {
    fVar7 = ABS(fVar16) * 3.4028235e+38;
    iVar4 = -(uint)(ABS(fVar18) < fVar7);
    iVar5 = -(uint)(ABS(fVar17) < fVar7);
    auVar2._4_4_ = iVar4;
    auVar2._0_4_ = iVar4;
    auVar2._8_4_ = iVar5;
    auVar2._12_4_ = iVar5;
    uVar3 = movmskpd(in_EAX,auVar2);
    if ((((uVar3 & 2) == 0) || ((uVar3 & 1) == 0)) || (fVar7 <= ABS(fVar6))) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this,"Bad chromaticities: RGBtoXYZ matrix is degenerate");
LAB_00159614:
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  __return_storage_ptr__->x[0][3] = 0.0;
  fVar17 = fVar17 / fVar16;
  __return_storage_ptr__->x[1][3] = 0.0;
  fVar18 = fVar18 / fVar16;
  fVar6 = fVar6 / fVar16;
  *(undefined8 *)(__return_storage_ptr__->x[2] + 3) = 0;
  *(float *)((long)(__return_storage_ptr__->x + 3) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 3) + 8) = 0.0;
  __return_storage_ptr__->x[3][3] = 1.0;
  *(ulong *)__return_storage_ptr__->x[0] = CONCAT44(fVar17 * fVar13,fVar17 * fVar12);
  __return_storage_ptr__->x[0][2] = ((1.0 - fVar12) - fVar13) * fVar17;
  *(ulong *)__return_storage_ptr__->x[1] = CONCAT44(fVar18 * fVar11,fVar18 * fVar10);
  __return_storage_ptr__->x[1][2] = ((1.0 - fVar10) - fVar11) * fVar18;
  *(ulong *)__return_storage_ptr__->x[2] = CONCAT44(fVar6 * fVar9,fVar6 * fVar8);
  __return_storage_ptr__->x[2][2] = ((1.0 - fVar8) - fVar9) * fVar6;
  return __return_storage_ptr__;
}

Assistant:

IMATH_NAMESPACE::M44f
RGBtoXYZ (const Chromaticities& chroma, float Y)
{
    //
    // For an explanation of how the color conversion matrix is derived,
    // see Roy Hall, "Illumination and Color in Computer Generated Imagery",
    // Springer-Verlag, 1989, chapter 3, "Perceptual Response"; and
    // Charles A. Poynton, "A Technical Introduction to Digital Video",
    // John Wiley & Sons, 1996, chapter 7, "Color science for video".
    //

    //
    // X and Z values of RGB value (1, 1, 1), or "white"
    //

    // prevent a division that rounds to zero
    if (std::abs (chroma.white.y) <= 1.f &&
        std::abs (chroma.white.x * Y) >= std::abs (chroma.white.y) * FLT_MAX)
    {
        throw std::invalid_argument (
            "Bad chromaticities: white.y cannot be zero");
    }

    float X = chroma.white.x * Y / chroma.white.y;
    float Z = (1 - chroma.white.x - chroma.white.y) * Y / chroma.white.y;

    //
    // Scale factors for matrix rows, compute numerators and common denominator
    //

    float d = chroma.red.x * (chroma.blue.y - chroma.green.y) +
              chroma.blue.x * (chroma.green.y - chroma.red.y) +
              chroma.green.x * (chroma.red.y - chroma.blue.y);

    float SrN =
        (X * (chroma.blue.y - chroma.green.y) -
         chroma.green.x * (Y * (chroma.blue.y - 1) + chroma.blue.y * (X + Z)) +
         chroma.blue.x * (Y * (chroma.green.y - 1) + chroma.green.y * (X + Z)));

    float SgN =
        (X * (chroma.red.y - chroma.blue.y) +
         chroma.red.x * (Y * (chroma.blue.y - 1) + chroma.blue.y * (X + Z)) -
         chroma.blue.x * (Y * (chroma.red.y - 1) + chroma.red.y * (X + Z)));

    float SbN =
        (X * (chroma.green.y - chroma.red.y) -
         chroma.red.x * (Y * (chroma.green.y - 1) + chroma.green.y * (X + Z)) +
         chroma.green.x * (Y * (chroma.red.y - 1) + chroma.red.y * (X + Z)));

    if (std::abs (d) < 1.f && (std::abs (SrN) >= std::abs (d) * FLT_MAX ||
                               std::abs (SgN) >= std::abs (d) * FLT_MAX ||
                               std::abs (SbN) >= std::abs (d) * FLT_MAX))
    {
        // cannot generate matrix if all RGB primaries have the same y value
        // or if they all have the an x value of zero
        // in both cases, the primaries are colinear, which makes them unusable
        throw std::invalid_argument (
            "Bad chromaticities: RGBtoXYZ matrix is degenerate");
    }

    float Sr = SrN / d;
    float Sg = SgN / d;
    float Sb = SbN / d;

    //
    // Assemble the matrix
    //

    IMATH_NAMESPACE::M44f M;

    M[0][0] = Sr * chroma.red.x;
    M[0][1] = Sr * chroma.red.y;
    M[0][2] = Sr * (1 - chroma.red.x - chroma.red.y);

    M[1][0] = Sg * chroma.green.x;
    M[1][1] = Sg * chroma.green.y;
    M[1][2] = Sg * (1 - chroma.green.x - chroma.green.y);

    M[2][0] = Sb * chroma.blue.x;
    M[2][1] = Sb * chroma.blue.y;
    M[2][2] = Sb * (1 - chroma.blue.x - chroma.blue.y);

    return M;
}